

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O1

void __thiscall btBoxShape::getVertex(btBoxShape *this,int i,btVector3 *vtx)

{
  undefined8 uVar1;
  uint uVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar3;
  uint uVar4;
  float local_28;
  float fStack_24;
  
  uVar1 = *(undefined8 *)
           (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
           m_implicitShapeDimensions.m_floats;
  fVar3 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[2];
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  uVar2 = (uint)i >> 2 & 1;
  fVar3 = extraout_XMM0_Da_01 + fVar3;
  local_28 = (float)uVar1;
  fStack_24 = (float)((ulong)uVar1 >> 0x20);
  uVar4 = (uint)i >> 1 & 1;
  *(ulong *)vtx->m_floats =
       CONCAT44((float)(uVar4 ^ 1) * (extraout_XMM0_Da_00 + fStack_24) -
                (float)uVar4 * (extraout_XMM0_Da_00 + fStack_24),
                (float)(i & 1U ^ 1) * (extraout_XMM0_Da + local_28) -
                (float)(i & 1U) * (extraout_XMM0_Da + local_28));
  vtx->m_floats[2] = (float)(uVar2 ^ 1) * fVar3 - (float)uVar2 * fVar3;
  vtx->m_floats[3] = 0.0;
  return;
}

Assistant:

virtual void getVertex(int i,btVector3& vtx) const
	{
		btVector3 halfExtents = getHalfExtentsWithMargin();

		vtx = btVector3(
				halfExtents.x() * (1-(i&1)) - halfExtents.x() * (i&1),
				halfExtents.y() * (1-((i&2)>>1)) - halfExtents.y() * ((i&2)>>1),
				halfExtents.z() * (1-((i&4)>>2)) - halfExtents.z() * ((i&4)>>2));
	}